

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcpdial.c
# Opt level: O0

int tcp_dialer_set_locaddr(void *arg,void *buf,size_t sz,nni_type t)

{
  size_t sVar1;
  sockaddr_in6 *sin6;
  int rv;
  size_t len;
  sockaddr_in *sin;
  sockaddr_storage ss;
  nng_sockaddr sa;
  nni_tcp_dialer *d;
  nni_type t_local;
  size_t sz_local;
  void *buf_local;
  void *arg_local;
  
  arg_local._4_4_ = nni_copyin_sockaddr((nng_sockaddr *)&ss.__ss_align,buf,t);
  if (arg_local._4_4_ == 0) {
    sVar1 = nni_posix_nn2sockaddr(&sin,(nni_sockaddr *)&ss.__ss_align);
    if (sVar1 == 0) {
      arg_local._4_4_ = 0xf;
    }
    else {
      if ((short)sin == 2) {
        if (sin._2_2_ != 0) {
          return 0xf;
        }
      }
      else {
        if ((short)sin != 10) {
          return 0xf;
        }
        if (sin._2_2_ != 0) {
          return 0xf;
        }
      }
      if (arg != (void *)0x0) {
        nni_mtx_lock((nni_mtx *)((long)arg + 0xa8));
        if ((*(byte *)((long)arg + 0x18) & 1) != 0) {
          nni_mtx_unlock((nni_mtx *)((long)arg + 0xa8));
          return 7;
        }
        memcpy((void *)((long)arg + 0x20),&sin,0x80);
        *(size_t *)((long)arg + 0xa0) = sVar1;
        nni_mtx_unlock((nni_mtx *)((long)arg + 0xa8));
      }
      arg_local._4_4_ = 0;
    }
  }
  return arg_local._4_4_;
}

Assistant:

static int
tcp_dialer_set_locaddr(void *arg, const void *buf, size_t sz, nni_type t)
{
	nni_tcp_dialer         *d = arg;
	nng_sockaddr            sa;
	struct sockaddr_storage ss;
	struct sockaddr_in     *sin;
	size_t                  len;
	int                     rv;
#ifdef NNG_ENABLE_IPV6
	struct sockaddr_in6 *sin6;
#endif
	NNI_ARG_UNUSED(sz);

	if ((rv = nni_copyin_sockaddr(&sa, buf, t)) != 0) {
		return (rv);
	}
	if ((len = nni_posix_nn2sockaddr(&ss, &sa)) == 0) {
		return (NNG_EADDRINVAL);
	}
	// Ensure we are either IPv4 or IPv6, and port is not set.  (We
	// do not allow binding to a specific port.)
	switch (ss.ss_family) {
	case AF_INET:
		sin = (void *) &ss;
		if (sin->sin_port != 0) {
			return (NNG_EADDRINVAL);
		}
		break;

#ifdef NNG_ENABLE_IPV6
	case AF_INET6:
		sin6 = (void *) &ss;
		if (sin6->sin6_port != 0) {
			return (NNG_EADDRINVAL);
		}
		break;
#endif // __NG_INET6

	default:
		return (NNG_EADDRINVAL);
	}
	if (d != NULL) {
		nni_mtx_lock(&d->mtx);
		if (d->closed) {
			nni_mtx_unlock(&d->mtx);
			return (NNG_ECLOSED);
		}
		d->src    = ss;
		d->srclen = len;
		nni_mtx_unlock(&d->mtx);
	}
	return (0);
}